

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     resize_if_allowed<Eigen::Matrix<float,_1,_1,0,8,1>,Eigen::Matrix<float,_1,_1,0,_1,1>,float,float>
               (Matrix<float,__1,__1,_0,_8,_1> *dst,Matrix<float,__1,__1,_0,__1,_1> *src,
               assign_op<float,_float> *param_3)

{
  Index IVar1;
  Index cols;
  Index IVar2;
  bool bVar3;
  Index dstCols;
  Index dstRows;
  assign_op<float,_float> *param_2_local;
  Matrix<float,__1,__1,_0,__1,_1> *src_local;
  Matrix<float,__1,__1,_0,_8,_1> *dst_local;
  
  IVar1 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>::rows
                    (&src->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,_1>_>);
  cols = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_1>_>::cols
                   (&src->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,_1>_>);
  IVar2 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_8,_1>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_8,_1>_>);
  if (IVar2 == IVar1) {
    IVar2 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_8,_1>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_8,_1>_>);
    if (IVar2 == cols) goto LAB_001f86fd;
  }
  PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_8,_1>_>::resize
            (&dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_8,_1>_>,IVar1,cols);
LAB_001f86fd:
  IVar2 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_8,_1>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_8,_1>_>);
  bVar3 = false;
  if (IVar2 == IVar1) {
    IVar1 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_8,_1>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_8,_1>_>);
    bVar3 = IVar1 == cols;
  }
  if (!bVar3) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, -1, -1, 0, 8, 1>, SrcXprType = Eigen::Matrix<float, -1, -1, 0, -1, 1>, T1 = float, T2 = float]"
                 );
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void resize_if_allowed(DstXprType &dst, const SrcXprType& src, const internal::assign_op<T1,T2> &/*func*/)
{
  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if(((dst.rows()!=dstRows) || (dst.cols()!=dstCols)))
    dst.resize(dstRows, dstCols);
  eigen_assert(dst.rows() == dstRows && dst.cols() == dstCols);
}